

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

int ON_BrepMergeFaces(ON_Brep *B,int fid0,int fid1)

{
  int iVar1;
  uint uVar2;
  ON_BrepFace *pOVar3;
  ON_BrepEdge *pOVar4;
  ON_BrepTrim *pOVar5;
  ON_BrepTrim *pOVar6;
  ON_BrepFace *this;
  ON_BrepFace *pOVar7;
  int *piVar8;
  ON_BrepTrim *pOVar9;
  ON_BrepLoop *pOVar10;
  ON_Surface *pOVar11;
  int local_14c;
  ON_Surface *pSrf;
  ON_BrepLoop *ML;
  ON_BrepFace *pOStack_108;
  int rc;
  ON_BrepFace *pDF;
  ON_BrepFace *pF;
  ON_BrepLoop *pD;
  ON_BrepLoop *pL;
  undefined1 local_d8 [8];
  ON_SimpleArray<int> new_tids;
  ON_BrepTrim *T_1;
  int ti1;
  ON_BrepLoop *L1;
  int lid1;
  ON_BrepTrim *T;
  int ti0;
  int i;
  ON_BrepLoop *L0;
  int lid0;
  ON_BrepTrim *T1;
  ON_BrepTrim *T0;
  ON_BrepTrim *T1_1;
  ON_BrepEdge *pEE;
  ON_BrepTrim *T0_1;
  int ti;
  ON_BrepLoop *L;
  int local_40;
  int tid1;
  int tid0;
  int li;
  ON_BrepEdge *pE;
  ON_BrepFace *F1;
  ON_BrepFace *F0;
  int fid1_local;
  int fid0_local;
  ON_Brep *B_local;
  
  if (fid0 == fid1) {
    B_local._4_4_ = -1;
  }
  else if ((fid0 < 0) ||
          (iVar1 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&B->m_F),
          iVar1 <= fid0)) {
    B_local._4_4_ = -1;
  }
  else {
    pOVar3 = ON_ClassArray<ON_BrepFace>::operator[]((ON_ClassArray<ON_BrepFace> *)&B->m_F,fid0);
    if (pOVar3->m_face_index < 0) {
      B_local._4_4_ = -1;
    }
    else if ((fid1 < 0) ||
            (iVar1 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&B->m_F),
            iVar1 <= fid1)) {
      B_local._4_4_ = -1;
    }
    else {
      pDF = ON_ClassArray<ON_BrepFace>::operator[]((ON_ClassArray<ON_BrepFace> *)&B->m_F,fid1);
      if (pDF->m_face_index < 0) {
        B_local._4_4_ = -1;
      }
      else if (pOVar3->m_si == pDF->m_si) {
        _tid0 = (ON_BrepEdge *)0x0;
        local_40 = -1;
        L._4_4_ = -1;
        for (tid1 = 0; iVar1 = ON_SimpleArray<int>::Count(&pOVar3->m_li),
            tid1 < iVar1 && _tid0 == (ON_BrepEdge *)0x0; tid1 = tid1 + 1) {
          piVar8 = ON_SimpleArray<int>::operator[](&pOVar3->m_li,tid1);
          pOVar10 = ON_ClassArray<ON_BrepLoop>::operator[]
                              ((ON_ClassArray<ON_BrepLoop> *)&B->m_L,*piVar8);
          for (T0_1._4_4_ = 0; iVar1 = ON_SimpleArray<int>::Count(&pOVar10->m_ti), pOVar4 = _tid0,
              T0_1._4_4_ < iVar1 && _tid0 == (ON_BrepEdge *)0x0; T0_1._4_4_ = T0_1._4_4_ + 1) {
            piVar8 = ON_SimpleArray<int>::operator[](&pOVar10->m_ti,T0_1._4_4_);
            pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                               ((ON_ClassArray<ON_BrepTrim> *)&B->m_T,*piVar8);
            pOVar4 = ON_BrepTrim::Edge(pOVar5);
            if ((pOVar4 != (ON_BrepEdge *)0x0) &&
               (iVar1 = ON_SimpleArray<int>::Count(&pOVar4->m_ti), iVar1 == 2)) {
              local_40 = pOVar5->m_trim_index;
              piVar8 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,0);
              if (*piVar8 == local_40) {
                piVar8 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,1);
                local_14c = *piVar8;
              }
              else {
                piVar8 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,0);
                local_14c = *piVar8;
              }
              L._4_4_ = local_14c;
              if ((-1 < local_40) && (-1 < local_14c)) {
                pOVar6 = ON_ClassArray<ON_BrepTrim>::operator[]
                                   ((ON_ClassArray<ON_BrepTrim> *)&B->m_T,local_14c);
                iVar1 = ON_BrepTrim::FaceIndexOf(pOVar6);
                if ((iVar1 == fid1) &&
                   (((pOVar5->m_bRev3d & 1U) != (pOVar6->m_bRev3d & 1U) &&
                    (pOVar5->m_iso == pOVar6->m_iso)))) break;
              }
            }
          }
          _tid0 = pOVar4;
        }
        if (((_tid0 == (ON_BrepEdge *)0x0) || (local_40 < 0)) || (L._4_4_ < 0)) {
          B_local._4_4_ = -1;
        }
        else {
          pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                             ((ON_ClassArray<ON_BrepTrim> *)&B->m_T,local_40);
          pOVar6 = ON_ClassArray<ON_BrepTrim>::operator[]
                             ((ON_ClassArray<ON_BrepTrim> *)&B->m_T,L._4_4_);
          if (pOVar5->m_li < 0) {
            B_local._4_4_ = -1;
          }
          else {
            this = (ON_BrepFace *)
                   ON_ClassArray<ON_BrepLoop>::operator[]
                             ((ON_ClassArray<ON_BrepLoop> *)&B->m_L,pOVar5->m_li);
            if (*(int *)&(this->super_ON_SurfaceProxy).field_0x1c < 0) {
              B_local._4_4_ = -1;
            }
            else {
              pOVar7 = ON_BrepLoop::Face((ON_BrepLoop *)this);
              if (pOVar7 == pOVar3) {
                T._0_4_ = -1;
                for (T._4_4_ = 0;
                    iVar1 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&this->m_face_user),
                    T._4_4_ < iVar1; T._4_4_ = T._4_4_ + 1) {
                  piVar8 = ON_SimpleArray<int>::operator[]
                                     ((ON_SimpleArray<int> *)&this->m_face_user,T._4_4_);
                  pOVar9 = ON_ClassArray<ON_BrepTrim>::operator[]
                                     ((ON_ClassArray<ON_BrepTrim> *)&B->m_T,*piVar8);
                  if (pOVar9->m_trim_index == local_40) {
                    T._0_4_ = T._4_4_;
                    break;
                  }
                }
                if ((int)T < 0) {
                  B_local._4_4_ = -1;
                }
                else if (pOVar6->m_li < 0) {
                  B_local._4_4_ = -1;
                }
                else {
                  pD = ON_ClassArray<ON_BrepLoop>::operator[]
                                 ((ON_ClassArray<ON_BrepLoop> *)&B->m_L,pOVar6->m_li);
                  if (*(int *)&(((ON_BrepFace *)pD)->super_ON_SurfaceProxy).field_0x1c < 0) {
                    B_local._4_4_ = -1;
                  }
                  else {
                    pOVar7 = ON_BrepLoop::Face(pD);
                    if (pOVar7 == pDF) {
                      T_1._4_4_ = -1;
                      for (T._4_4_ = 0;
                          iVar1 = ON_SimpleArray<int>::Count
                                            ((ON_SimpleArray<int> *)
                                             &((ON_BrepFace *)pD)->m_face_user), T._4_4_ < iVar1;
                          T._4_4_ = T._4_4_ + 1) {
                        piVar8 = ON_SimpleArray<int>::operator[]
                                           ((ON_SimpleArray<int> *)&((ON_BrepFace *)pD)->m_face_user
                                            ,T._4_4_);
                        new_tids._16_8_ =
                             ON_ClassArray<ON_BrepTrim>::operator[]
                                       ((ON_ClassArray<ON_BrepTrim> *)&B->m_T,*piVar8);
                        if (((ON_BrepTrim *)new_tids._16_8_)->m_trim_index == L._4_4_) {
                          T_1._4_4_ = T._4_4_;
                          break;
                        }
                      }
                      if (T_1._4_4_ < 0) {
                        B_local._4_4_ = -1;
                      }
                      else {
                        ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)local_d8);
                        CreateNewTrimList((ON_BrepLoop *)this,(int)T,pD,T_1._4_4_,
                                          (ON_SimpleArray<int> *)local_d8);
                        ML._4_4_ = fid1;
                        pOStack_108 = pOVar3;
                        pF = this;
                        if (*(int *)&(((ON_BrepFace *)pD)->m_li).m_a != 2) {
                          ML._4_4_ = fid0;
                          pOStack_108 = pDF;
                          pDF = pOVar3;
                          pF = (ON_BrepFace *)pD;
                          pD = (ON_BrepLoop *)this;
                        }
                        ON_SimpleArray<int>::operator=(&pD->m_ti,(ON_SimpleArray<int> *)local_d8);
                        ON_BoundingBox::Destroy(&pD->m_pbox);
                        ON_SimpleArray<int>::SetCount((ON_SimpleArray<int> *)&pF->m_face_user,0);
                        pOVar5->m_li = -1;
                        pOVar6->m_li = -1;
                        ON_Brep::DeleteTrim(B,pOVar5,true);
                        ON_Brep::DeleteTrim(B,pOVar6,true);
                        ON_Brep::DeleteLoop(B,(ON_BrepLoop *)pF,true);
                        for (T._4_4_ = 0; iVar1 = ON_SimpleArray<int>::Count(&pD->m_ti),
                            T._4_4_ < iVar1; T._4_4_ = T._4_4_ + 1) {
                          iVar1 = pD->m_loop_index;
                          piVar8 = ON_SimpleArray<int>::operator[](&pD->m_ti,T._4_4_);
                          pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                                             ((ON_ClassArray<ON_BrepTrim> *)&B->m_T,*piVar8);
                          pOVar5->m_li = iVar1;
                        }
                        ON_Brep::MatchTrimEnds(B,pD);
                        for (T._4_4_ = 0; iVar1 = ON_SimpleArray<int>::Count(&pOStack_108->m_li),
                            T._4_4_ < iVar1; T._4_4_ = T._4_4_ + 1) {
                          piVar8 = ON_SimpleArray<int>::operator[](&pOStack_108->m_li,T._4_4_);
                          pOVar10 = ON_ClassArray<ON_BrepLoop>::operator[]
                                              ((ON_ClassArray<ON_BrepLoop> *)&B->m_L,*piVar8);
                          pOVar10->m_fi = ML._4_4_;
                          ON_SimpleArray<int>::Append(&pDF->m_li,&pOVar10->m_loop_index);
                        }
                        ON_SimpleArray<int>::SetCount(&pOStack_108->m_li,0);
                        ON_Brep::DeleteFace(B,pOStack_108,true);
                        pOVar3 = ON_ClassArray<ON_BrepFace>::operator[]
                                           ((ON_ClassArray<ON_BrepFace> *)&B->m_F,ML._4_4_);
                        pOVar11 = ON_BrepFace::SurfaceOf(pOVar3);
                        uVar2 = (*(pOVar11->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30]
                                )(pOVar11,0);
                        if (((uVar2 & 1) != 0) ||
                           (uVar2 = (*(pOVar11->super_ON_Geometry).super_ON_Object._vptr_ON_Object
                                      [0x30])(pOVar11,1), (uVar2 & 1) != 0)) {
                          pOVar3 = ON_ClassArray<ON_BrepFace>::operator[]
                                             ((ON_ClassArray<ON_BrepFace> *)&B->m_F,ML._4_4_);
                          ON_Brep::SetTrimTypeFlags(B,pOVar3,false);
                        }
                        pOVar3 = ON_ClassArray<ON_BrepFace>::operator[]
                                           ((ON_ClassArray<ON_BrepFace> *)&B->m_F,ML._4_4_);
                        ON_BrepRemoveSlits(pOVar3);
                        pOVar3 = ON_ClassArray<ON_BrepFace>::operator[]
                                           ((ON_ClassArray<ON_BrepFace> *)&B->m_F,ML._4_4_);
                        (*(B->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(B,pOVar3,1);
                        B_local._4_4_ = ML._4_4_;
                        ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_d8);
                      }
                    }
                    else {
                      B_local._4_4_ = -1;
                    }
                  }
                }
              }
              else {
                B_local._4_4_ = -1;
              }
            }
          }
        }
      }
      else {
        B_local._4_4_ = -1;
      }
    }
  }
  return B_local._4_4_;
}

Assistant:

int ON_BrepMergeFaces(ON_Brep& B, int fid0, int fid1)

{
  if (fid0 == fid1)
    return -1;

  if (fid0 < 0 || fid0 >= B.m_F.Count())
    return -1;
  ON_BrepFace& F0 = B.m_F[fid0];
  if (F0.m_face_index < 0)
    return -1;

  if (fid1 < 0 || fid1 >= B.m_F.Count())
    return -1;
  ON_BrepFace& F1 = B.m_F[fid1];
  if (F1.m_face_index < 0)
    return -1;

  if (F0.m_si != F1.m_si)
    return -1;

  //Find a manifold edge that joins the two faces and combine the loops by removing 
  //the trims at that edge.

  ON_BrepEdge* pE = 0;

  int li;
  int tid0 = -1, tid1 = -1;
  for (li=0; li<F0.m_li.Count() && !pE; li++){
    ON_BrepLoop& L = B.m_L[F0.m_li[li]];
    int ti;
    for (ti=0; ti<L.m_ti.Count() && !pE; ti++){
      ON_BrepTrim& T0 = B.m_T[L.m_ti[ti]];
      ON_BrepEdge* pEE = T0.Edge();
      if (!pEE || pEE->m_ti.Count() != 2)
        continue;
      tid0 =T0.m_trim_index;
      tid1 = (pEE->m_ti[0] == tid0) ? pEE->m_ti[1] : pEE->m_ti[0];
      if (tid0 < 0 || tid1 < 0)
        continue;
      ON_BrepTrim& T1 = B.m_T[tid1];
      if (T1.FaceIndexOf() == fid1 && T0.m_bRev3d != T1.m_bRev3d 
        && T0.m_iso == T1.m_iso){//Don't combine across seams.
        pE = pEE;
        break;
      }
    }
  }

  if (!pE || tid0 < 0 || tid1 < 0)
    return -1;

  ON_BrepTrim& T0 = B.m_T[tid0];
  ON_BrepTrim& T1 = B.m_T[tid1];

  int lid0 = T0.m_li;
  if (lid0 < 0)
    return -1;
  ON_BrepLoop& L0 = B.m_L[lid0];
  if (L0.m_loop_index < 0)
    return -1;
  if (L0.Face() != &F0)
    return -1;
  int i;
  int ti0 = -1;
  for (i=0; i<L0.m_ti.Count(); i++){
    const ON_BrepTrim& T = B.m_T[L0.m_ti[i]];
    if (T.m_trim_index == tid0){
      ti0 = i;
      break;
    }
  }
  if (ti0 < 0)
    return -1;

  int lid1 = T1.m_li;
  if (lid1 < 0)
    return -1;
  ON_BrepLoop& L1 = B.m_L[lid1];
  if (L1.m_loop_index < 0)
    return -1;
  if (L1.Face() != &F1)
    return -1;
  int ti1 = -1;
  for (i=0; i<L1.m_ti.Count(); i++){
    const ON_BrepTrim& T = B.m_T[L1.m_ti[i]];
    if (T.m_trim_index == tid1){
      ti1 = i;
      break;
    }
  }
  if (ti1 < 0)
    return -1;


  ON_SimpleArray<int> new_tids;
  CreateNewTrimList(L0, ti0, L1, ti1, new_tids);

  ON_BrepLoop* pL;
  ON_BrepLoop* pD;
  ON_BrepFace* pF;
  ON_BrepFace* pDF;
  int rc;
  if (L1.m_type != ON_BrepLoop::inner){
    pL = &L0;
    pD = &L1;
    rc = fid0;
    pF = &F0;
    pDF = &F1;
  }
  else {
    pL = &L1;
    pD = &L0;
    rc = fid1;
    pF = &F1;
    pDF = &F0;
  }
  pL->m_ti = new_tids;
  pL->m_pbox.Destroy();
  pD->m_ti.SetCount(0);
  T0.m_li = -1;
  T1.m_li = -1;
  B.DeleteTrim(T0, true);
  B.DeleteTrim(T1, true);
  B.DeleteLoop(*pD, true);
  for (i=0; i<pL->m_ti.Count(); i++)
    B.m_T[pL->m_ti[i]].m_li = pL->m_loop_index;

  B.MatchTrimEnds(*pL);

  for (i=0; i<pDF->m_li.Count(); i++){
    ON_BrepLoop& ML = B.m_L[pDF->m_li[i]];
    ML.m_fi = rc;
    pF->m_li.Append(ML.m_loop_index);
  }
  pDF->m_li.SetCount(0);
  B.DeleteFace(*pDF, true);
  const ON_Surface* pSrf = B.m_F[rc].SurfaceOf();
  if (pSrf->IsClosed(0) || pSrf->IsClosed(1))
    B.SetTrimTypeFlags(B.m_F[rc]);//Some mateds may have become seams.
  ON_BrepRemoveSlits(B.m_F[rc]);

  B.SetTrimBoundingBoxes(B.m_F[rc], true);

  return rc;

}